

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWDAnalyzerResults.cpp
# Opt level: O0

void __thiscall
SWDAnalyzerResults::GenerateExportFile
          (SWDAnalyzerResults *this,char *file,DisplayBase display_base,U32 export_type_user_id)

{
  bool bVar1;
  byte bVar2;
  ostream *this_00;
  char *pcVar3;
  value_type local_4c0 [40];
  value_type local_498 [4];
  SWDRegisters reg;
  allocator local_471;
  string local_470 [39];
  allocator local_449;
  string local_448 [39];
  allocator local_421;
  string local_420 [39];
  allocator local_3f9;
  string local_3f8 [32];
  value_type local_3d8 [32];
  undefined1 local_3b8 [40];
  string local_390 [39];
  allocator local_369;
  string local_368 [39];
  allocator local_341;
  string local_340 [32];
  SWDAnalyzerResults local_320;
  SWDRequestFrame *local_300;
  SWDRequestFrame *req;
  string local_2f0 [32];
  SWDAnalyzerResults local_2d0;
  Frame local_2b0 [40];
  pointer local_288;
  U64 fcnt;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  record;
  U64 num_frames;
  Frame f;
  DisplayBase local_250;
  undefined4 uStack_24c;
  U32 local_248;
  char local_240;
  U32 sample_rate;
  U64 trigger_sample;
  ofstream of;
  U32 export_type_user_id_local;
  DisplayBase display_base_local;
  char *file_local;
  SWDAnalyzerResults *this_local;
  
  std::ofstream::ofstream(&trigger_sample,file,_S_out);
  Analyzer::GetTriggerSample();
  Analyzer::GetSampleRate();
  this_00 = std::operator<<((ostream *)&trigger_sample,
                            "Time\tType\tR/W\tAP/DP\tRegister\tRequest byte\tACK\tWData\tWData details"
                           );
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  Frame::Frame((Frame *)&num_frames);
  record.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)AnalyzerResults::GetNumFrames();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&fcnt);
  for (local_288 = (pointer)0x0;
      local_288 <
      record.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage; local_288 = local_288 + 1) {
    AnalyzerResults::GetFrame((ulonglong)local_2b0);
    memcpy(&num_frames,local_2b0,0x22);
    Frame::~Frame(local_2b0);
    if (local_240 == '\x02') {
      SaveRecord((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&fcnt,(ofstream *)&trigger_sample);
      GetSampleTimeStr_abi_cxx11_(&local_2d0,(S64)this);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&fcnt,(value_type *)&local_2d0);
      std::__cxx11::string::~string((string *)&local_2d0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2f0,"Line reset",(allocator *)((long)&req + 7));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&fcnt,(value_type *)local_2f0);
      std::__cxx11::string::~string(local_2f0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&req + 7));
      SaveRecord((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&fcnt,(ofstream *)&trigger_sample);
    }
    else if (local_240 == '\x03') {
      SaveRecord((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&fcnt,(ofstream *)&trigger_sample);
      local_300 = (SWDRequestFrame *)&num_frames;
      GetSampleTimeStr_abi_cxx11_(&local_320,(S64)this);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&fcnt,(value_type *)&local_320);
      std::__cxx11::string::~string((string *)&local_320);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_340,"Operation",&local_341);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&fcnt,(value_type *)local_340);
      std::__cxx11::string::~string(local_340);
      std::allocator<char>::~allocator((allocator<char> *)&local_341);
      bVar1 = SWDRequestFrame::IsRead(local_300);
      pcVar3 = "write";
      if (bVar1) {
        pcVar3 = "read";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_368,pcVar3,&local_369);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&fcnt,(value_type *)local_368);
      std::__cxx11::string::~string(local_368);
      std::allocator<char>::~allocator((allocator<char> *)&local_369);
      bVar1 = SWDRequestFrame::IsAccessPort(local_300);
      pcVar3 = " DebugPort";
      if (bVar1) {
        pcVar3 = " AccessPort";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_390,pcVar3 + 1,(allocator *)(local_3b8 + 0x27));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&fcnt,(value_type *)local_390);
      std::__cxx11::string::~string(local_390);
      std::allocator<char>::~allocator((allocator<char> *)(local_3b8 + 0x27));
      SWDRequestFrame::GetRegisterName_abi_cxx11_((SWDRequestFrame *)local_3b8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&fcnt,(value_type *)local_3b8);
      std::__cxx11::string::~string((string *)local_3b8);
      int2str_sal_abi_cxx11_
                ((U64)local_3d8,(DisplayBase)*(undefined8 *)&local_300->field_0x10,display_base);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&fcnt,local_3d8);
      std::__cxx11::string::~string((string *)local_3d8);
    }
    else if (local_240 == '\x05') {
      if (CONCAT44(uStack_24c,local_250) == 1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_3f8,"OK",&local_3f9);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&fcnt,(value_type *)local_3f8);
        std::__cxx11::string::~string(local_3f8);
        std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
      }
      else if (CONCAT44(uStack_24c,local_250) == 2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_420,"WAIT",&local_421);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&fcnt,(value_type *)local_420);
        std::__cxx11::string::~string(local_420);
        std::allocator<char>::~allocator((allocator<char> *)&local_421);
      }
      else if (CONCAT44(uStack_24c,local_250) == 4) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_448,"FAULT",&local_449);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&fcnt,(value_type *)local_448);
        std::__cxx11::string::~string(local_448);
        std::allocator<char>::~allocator((allocator<char> *)&local_449);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_470,"<disc>",&local_471);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&fcnt,(value_type *)local_470);
        std::__cxx11::string::~string(local_470);
        std::allocator<char>::~allocator((allocator<char> *)&local_471);
      }
    }
    else if (local_240 == '\x06') {
      int2str_sal_abi_cxx11_((U64)local_498,local_250,display_base);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&fcnt,local_498);
      std::__cxx11::string::~string((string *)local_498);
      GetRegisterValueDesc_abi_cxx11_((SWDRegisters)local_4c0,local_248,local_250);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&fcnt,local_4c0);
      std::__cxx11::string::~string((string *)local_4c0);
      SaveRecord((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&fcnt,(ofstream *)&trigger_sample);
    }
    bVar2 = AnalyzerResults::UpdateExportProgressAndCheckForCancel
                      ((ulonglong)this,(ulonglong)local_288);
    if ((bVar2 & 1) != 0) goto LAB_001123b3;
  }
  AnalyzerResults::UpdateExportProgressAndCheckForCancel
            ((ulonglong)this,
             (ulonglong)
             record.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage);
LAB_001123b3:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&fcnt);
  Frame::~Frame((Frame *)&num_frames);
  std::ofstream::~ofstream(&trigger_sample);
  return;
}

Assistant:

void SWDAnalyzerResults::GenerateExportFile( const char* file, DisplayBase display_base, U32 export_type_user_id )
{
    std::ofstream of( file, std::ios::out );

    U64 trigger_sample = mAnalyzer->GetTriggerSample();
    U32 sample_rate = mAnalyzer->GetSampleRate();

    of << "Time\tType\tR/W\tAP/DP\tRegister\tRequest byte\tACK\tWData\tWData details" << std::endl;

    Frame f;
    const U64 num_frames = GetNumFrames();
    std::vector<std::string> record;
    for( U64 fcnt = 0; fcnt < num_frames; fcnt++ )
    {
        // get the frame
        f = GetFrame( fcnt );

        if( f.mType == SWDFT_LineReset )
        {
            SaveRecord( record, of );

            record.push_back( GetSampleTimeStr( f.mStartingSampleInclusive ) );
            record.push_back( "Line reset" );
            SaveRecord( record, of );
        }
        else if( f.mType == SWDFT_Request )
        {
            SaveRecord( record, of );

            SWDRequestFrame& req( ( SWDRequestFrame& )f );
            record.push_back( GetSampleTimeStr( f.mStartingSampleInclusive ) );
            record.push_back( "Operation" );
            record.push_back( req.IsRead() ? "read" : "write" );
            record.push_back( req.IsAccessPort() ? "AccessPort" : "DebugPort" );
            record.push_back( req.GetRegisterName() );
            record.push_back( int2str_sal( req.mData1, display_base, 8 ) );
        }
        else if( f.mType == SWDFT_ACK )
        {
            if( f.mData1 == ACK_OK )
                record.push_back( "OK" );
            else if( f.mData1 == ACK_WAIT )
                record.push_back( "WAIT" );
            else if( f.mData1 == ACK_FAULT )
                record.push_back( "FAULT" );
            else
                record.push_back( "<disc>" );
        }
        else if( f.mType == SWDFT_WData )
        {
            record.push_back( int2str_sal( f.mData1, display_base, 32 ) );

            SWDRegisters reg( SWDRegisters( f.mData2 ) );
            record.push_back( GetRegisterValueDesc( reg, U32( f.mData1 ), display_base ) );

            SaveRecord( record, of );
        }

        if( UpdateExportProgressAndCheckForCancel( fcnt, num_frames ) )
            return;
    }

    UpdateExportProgressAndCheckForCancel( num_frames, num_frames );
}